

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  
  uVar1 = a->c;
  iVar10 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar7 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    iVar7 = 0;
    uVar16 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar16 = 0;
    }
    for (uVar8 = 0; uVar8 != uVar16; uVar8 = uVar8 + 1) {
      lVar9 = a->elemsize * a->cstep * uVar8;
      pvVar2 = a->data;
      lVar11 = b->elemsize * b->cstep * uVar8;
      pvVar3 = b->data;
      lVar12 = c->elemsize * c->cstep * uVar8;
      pvVar4 = c->data;
      lVar13 = 0;
      lVar14 = 0;
      for (iVar15 = 0; iVar15 + 7 < iVar10; iVar15 = iVar15 + 8) {
        auVar5 = vminps_avx(*(undefined1 (*) [32])((long)pvVar2 + lVar14 + lVar9),
                            *(undefined1 (*) [32])((long)pvVar3 + lVar14 + lVar11));
        *(undefined1 (*) [32])((long)pvVar4 + lVar14 + lVar12) = auVar5;
        lVar14 = lVar14 + 0x20;
        lVar13 = lVar13 + 8;
      }
      for (; iVar15 + 3 < iVar10; iVar15 = iVar15 + 4) {
        auVar6 = vminps_avx(*(undefined1 (*) [16])((long)pvVar2 + lVar14 + lVar9),
                            *(undefined1 (*) [16])((long)pvVar3 + lVar14 + lVar11));
        *(undefined1 (*) [16])((long)pvVar4 + lVar14 + lVar12) = auVar6;
        lVar14 = lVar14 + 0x10;
        lVar13 = lVar13 + 4;
      }
      for (; (int)lVar13 < iVar10; lVar13 = lVar13 + 1) {
        auVar6 = vminss_avx(ZEXT416(*(uint *)((long)pvVar3 + lVar13 * 4 + lVar11)),
                            ZEXT416(*(uint *)((long)pvVar2 + lVar13 * 4 + lVar9)));
        *(int *)((long)pvVar4 + lVar13 * 4 + lVar12) = auVar6._0_4_;
      }
    }
  }
  return iVar7;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}